

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O0

int __thiscall
ncnn::RNN::forward(RNN *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference __fn;
  float *__src;
  float *__src_00;
  float *__dest;
  Mat *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  void *in_R8;
  float *ptr;
  float *pr;
  float *pf;
  int i;
  int ret1;
  Mat hidden1;
  int ret0;
  Mat hidden0;
  Mat top_blob_reverse;
  Mat top_blob_forward;
  int ret;
  Mat *top_blob;
  Allocator *hidden_allocator;
  Mat hidden;
  int num_directions;
  int T;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffffab8;
  Mat *in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffac8;
  float in_stack_fffffffffffffacc;
  Mat *in_stack_fffffffffffffad0;
  undefined8 in_stack_fffffffffffffad8;
  Mat *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  int *local_4d8;
  int local_4ac;
  Mat *in_stack_fffffffffffffbe0;
  Mat *in_stack_fffffffffffffbe8;
  Mat *in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbfc;
  Mat *in_stack_fffffffffffffc00;
  Mat *in_stack_fffffffffffffc08;
  Mat *in_stack_fffffffffffffc20;
  Option *in_stack_fffffffffffffc28;
  Mat local_258;
  Mat local_210 [4];
  int local_ec;
  reference local_e8;
  int local_e0;
  Mat local_d0;
  int *local_88;
  Mat local_80;
  undefined4 local_38;
  int local_34;
  const_reference local_30;
  Mat *local_28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_34 = local_30->h;
  iVar3 = 2;
  local_38 = 1;
  if (*(int *)(in_RDI + 0xd8) == 2) {
    local_38 = 2;
  }
  ncnn::Mat::Mat(&local_80);
  sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
  if (sVar4 == 2) {
    local_4d8 = local_28->refcount;
  }
  else {
    local_4d8 = (int *)local_28->elemsize;
  }
  local_88 = local_4d8;
  sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
  if (sVar4 == 2) {
    __fn = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
    ncnn::Mat::clone(&local_d0,(__fn *)__fn,local_88,iVar3,in_R8);
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               in_stack_fffffffffffffac0);
    ncnn::Mat::~Mat((Mat *)0x51ce9c);
  }
  else {
    ncnn::Mat::create(in_stack_fffffffffffffae0,(int)((ulong)in_stack_fffffffffffffad8 >> 0x20),
                      (int)in_stack_fffffffffffffad8,(size_t)in_stack_fffffffffffffad0,
                      (Allocator *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffac0);
    if (bVar1) {
      local_4 = -100;
      local_e0 = 1;
      goto LAB_0051d7fe;
    }
    ncnn::Mat::fill(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
  }
  local_e8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  ncnn::Mat::create(in_stack_fffffffffffffae0,(int)((ulong)in_stack_fffffffffffffad8 >> 0x20),
                    (int)in_stack_fffffffffffffad8,(size_t)in_stack_fffffffffffffad0,
                    (Allocator *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  iVar3 = (int)((ulong)in_stack_fffffffffffffae0 >> 0x20);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffac0);
  if (bVar1) {
    local_4 = -100;
    local_e0 = 1;
  }
  else {
    if ((*(int *)(in_RDI + 0xd8) == 0) || (*(int *)(in_RDI + 0xd8) == 1)) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),iVar3)
      ;
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),iVar3)
      ;
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),iVar3)
      ;
      in_stack_fffffffffffffab8 = &local_80;
      in_stack_fffffffffffffac0 = local_28;
      iVar2 = rnn(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
                  in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                  in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
      ncnn::Mat::~Mat((Mat *)0x51d0dd);
      ncnn::Mat::~Mat((Mat *)0x51d0ea);
      ncnn::Mat::~Mat((Mat *)0x51d0f7);
      local_ec = iVar2;
      if (iVar2 != 0) {
        local_e0 = 1;
        local_4 = iVar2;
        goto LAB_0051d7fe;
      }
    }
    if (*(int *)(in_RDI + 0xd8) == 2) {
      ncnn::Mat::Mat(in_stack_fffffffffffffad0,(int)in_stack_fffffffffffffacc,
                     in_stack_fffffffffffffac8,(size_t)in_stack_fffffffffffffac0,
                     (Allocator *)in_stack_fffffffffffffab8);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffac0);
      if (bVar1) {
        local_4 = -100;
        local_e0 = 1;
      }
      else {
        ncnn::Mat::Mat(in_stack_fffffffffffffad0,(int)in_stack_fffffffffffffacc,
                       in_stack_fffffffffffffac8,(size_t)in_stack_fffffffffffffac0,
                       (Allocator *)in_stack_fffffffffffffab8);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffac0);
        if (bVar1) {
          local_4 = -100;
          local_e0 = 1;
        }
        else {
          ncnn::Mat::row_range
                    ((Mat *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                     (int)((ulong)in_stack_fffffffffffffac0 >> 0x20),(int)in_stack_fffffffffffffac0)
          ;
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                             iVar3);
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                             iVar3);
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                             iVar3);
          in_stack_fffffffffffffac0 = local_28;
          iVar2 = rnn(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
                      in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                      in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
          ncnn::Mat::~Mat((Mat *)0x51d38f);
          ncnn::Mat::~Mat((Mat *)0x51d39c);
          ncnn::Mat::~Mat((Mat *)0x51d3a9);
          if (iVar2 == 0) {
            ncnn::Mat::row_range
                      ((Mat *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                       (int)((ulong)in_stack_fffffffffffffac0 >> 0x20),
                       (int)in_stack_fffffffffffffac0);
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                               iVar3);
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                               iVar3);
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                               iVar3);
            iVar3 = rnn(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                        in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf0,
                        in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                        in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
            ncnn::Mat::~Mat((Mat *)0x51d54c);
            ncnn::Mat::~Mat((Mat *)0x51d559);
            ncnn::Mat::~Mat((Mat *)0x51d566);
            in_stack_fffffffffffffac0 = local_28;
            if (iVar3 == 0) {
              for (local_4ac = 0; local_4ac < local_34; local_4ac = local_4ac + 1) {
                __src = ncnn::Mat::row(local_210,local_4ac);
                __src_00 = ncnn::Mat::row(&local_258,local_4ac);
                __dest = ncnn::Mat::row(local_e8,local_4ac);
                memcpy(__dest,__src,(long)*(int *)(in_RDI + 0xd0) << 2);
                memcpy(__dest + *(int *)(in_RDI + 0xd0),__src_00,(long)*(int *)(in_RDI + 0xd0) << 2)
                ;
              }
              local_e0 = 0;
            }
            else {
              local_e0 = 1;
              local_4 = iVar3;
            }
            ncnn::Mat::~Mat((Mat *)0x51d73f);
          }
          else {
            local_e0 = 1;
            local_4 = iVar2;
          }
          ncnn::Mat::~Mat((Mat *)0x51d74c);
        }
        ncnn::Mat::~Mat((Mat *)0x51d759);
      }
      ncnn::Mat::~Mat((Mat *)0x51d766);
      if (local_e0 != 0) goto LAB_0051d7fe;
    }
    sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
    if (sVar4 == 2) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,1);
      ncnn::Mat::operator=
                ((Mat *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                 in_stack_fffffffffffffac0);
    }
    local_4 = 0;
    local_e0 = 1;
  }
LAB_0051d7fe:
  ncnn::Mat::~Mat((Mat *)0x51d80b);
  return local_4;
}

Assistant:

int RNN::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Allocator* hidden_allocator = top_blobs.size() == 2 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 2)
    {
        hidden = bottom_blobs[1].clone(hidden_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = rnn(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        int ret0 = rnn(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        int ret1 = rnn(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 2)
    {
        top_blobs[1] = hidden;
    }

    return 0;
}